

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint RemSP::MemMerge(uint i,uint j)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  pointer puVar5;
  pointer piVar6;
  int *piVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  int *piVar11;
  int *piVar12;
  
  piVar6 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    piVar12 = piVar6 + (int)i;
    *piVar12 = *piVar12 + 1;
    puVar9 = puVar5 + (int)i;
    uVar3 = *puVar9;
    piVar6[(int)j] = piVar6[(int)j] + 1;
    if (uVar3 == puVar5[(int)j]) {
LAB_0011c786:
      *piVar12 = *piVar12 + 1;
      return *puVar9;
    }
    *piVar12 = *piVar12 + 1;
    piVar1 = piVar6 + (int)j;
    puVar2 = puVar5 + (int)j;
    uVar3 = *puVar9;
    iVar4 = *piVar1;
    *piVar1 = iVar4 + 1;
    if (*puVar2 < uVar3) {
      iVar4 = *piVar12;
      *piVar12 = iVar4 + 1;
      piVar7 = piVar1;
      puVar8 = puVar2;
      puVar10 = puVar9;
      piVar11 = piVar12;
      if (i == *puVar9) {
LAB_0011c77c:
        *piVar7 = *piVar7 + 1;
        uVar3 = *puVar8;
        *piVar11 = *piVar11 + 1;
        *puVar10 = uVar3;
        goto LAB_0011c786;
      }
      *piVar12 = iVar4 + 2;
      i = *puVar9;
      piVar7 = piVar12;
      puVar8 = puVar9;
      puVar9 = puVar2;
      piVar12 = piVar1;
    }
    else {
      *piVar1 = iVar4 + 2;
      piVar7 = piVar12;
      puVar8 = puVar9;
      puVar10 = puVar2;
      piVar11 = piVar1;
      if (j == *puVar2) goto LAB_0011c77c;
      *piVar1 = iVar4 + 3;
      j = *puVar2;
      piVar7 = piVar1;
      puVar8 = puVar2;
    }
    *piVar12 = *piVar12 + 1;
    uVar3 = *puVar9;
    *piVar7 = *piVar7 + 1;
    *puVar8 = uVar3;
  } while( true );
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        unsigned root_i(i), root_j(j);
        while (mem_P_[root_i] != mem_P_[root_j]) {
            if (mem_P_[root_i] > mem_P_[root_j]) {
                if (root_i == mem_P_[root_i]) {
                    mem_P_[root_i] = mem_P_[root_j];
                    return mem_P_[root_i];
                }
                unsigned z = mem_P_[root_i];
                mem_P_[root_i] = mem_P_[root_j];
                root_i = z;
            }
            else {
                if (root_j == mem_P_[root_j]) {
                    mem_P_[root_j] = mem_P_[root_i];
                    return mem_P_[root_i];
                }
                unsigned z = mem_P_[root_j];
                mem_P_[root_j] = mem_P_[root_i];
                root_j = z;
            }
        }
        return mem_P_[root_i];
    }